

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mesh.cpp
# Opt level: O0

LOs __thiscall
Omega_h::ents_on_closure
          (Omega_h *this,Mesh *mesh,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *class_names,Int ent_dim)

{
  void **__return_storage_ptr__;
  void *extraout_RDX;
  LOs LVar1;
  Read<signed_char> local_70 [2];
  undefined1 local_50 [8];
  Read<signed_char> ents_are_on;
  vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_> class_pairs;
  Int ent_dim_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *class_names_local;
  Mesh *mesh_local;
  
  __return_storage_ptr__ = &ents_are_on.write_.shared_alloc_.direct_ptr;
  to_class_pairs((vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_> *)
                 __return_storage_ptr__,mesh,class_names);
  mark_class_closures((Omega_h *)local_50,mesh,ent_dim,
                      (vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_> *)
                      __return_storage_ptr__);
  Read<signed_char>::Read(local_70,(Read<signed_char> *)local_50);
  collect_marked(this,local_70);
  Read<signed_char>::~Read(local_70);
  Read<signed_char>::~Read((Read<signed_char> *)local_50);
  std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::~vector
            ((vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_> *)
             &ents_are_on.write_.shared_alloc_.direct_ptr);
  LVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  LVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar1.write_.shared_alloc_;
}

Assistant:

LOs ents_on_closure(
    Mesh* mesh, std::set<std::string> const& class_names, Int ent_dim) {
  auto class_pairs = to_class_pairs(mesh, class_names);
  auto ents_are_on = mark_class_closures(mesh, ent_dim, class_pairs);
  return collect_marked(ents_are_on);
}